

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O1

void __thiscall
btAlignedObjectArray<btConvexHullInternal::Point32>::quickSortInternal<pointCmp>
          (btAlignedObjectArray<btConvexHullInternal::Point32> *this,pointCmp *CompareFunc,int lo,
          int hi)

{
  int iVar1;
  int iVar2;
  Point32 *pPVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  undefined8 *puVar10;
  Point32 *pPVar11;
  long lVar12;
  int lo_00;
  ulong uVar13;
  
  uVar13 = (ulong)(uint)lo;
  do {
    lo_00 = (int)uVar13;
    pPVar3 = this->m_data;
    iVar9 = (hi + lo_00) / 2;
    iVar1 = pPVar3[iVar9].x;
    iVar2 = pPVar3[iVar9].y;
    iVar9 = pPVar3[iVar9].z;
    uVar8 = (ulong)(uint)hi;
    do {
      pPVar3 = this->m_data;
      uVar13 = (ulong)(int)uVar13;
      for (pPVar11 = pPVar3 + uVar13;
          (pPVar11->y < iVar2 ||
          ((pPVar11->y == iVar2 &&
           ((pPVar11->x < iVar1 || ((pPVar11->x == iVar1 && (pPVar11->z < iVar9))))))));
          pPVar11 = pPVar11 + 1) {
        uVar13 = uVar13 + 1;
      }
      uVar8 = (ulong)(int)uVar8;
      for (lVar12 = uVar8 << 4;
          (iVar7 = *(int *)((long)&pPVar3->y + lVar12), iVar2 < iVar7 ||
          ((iVar2 == iVar7 &&
           ((iVar7 = *(int *)((long)&pPVar3->x + lVar12), iVar1 < iVar7 ||
            ((iVar1 == iVar7 && (iVar9 < *(int *)((long)&pPVar3->z + lVar12)))))))));
          lVar12 = lVar12 + -0x10) {
        uVar8 = uVar8 - 1;
      }
      if ((long)uVar13 <= (long)uVar8) {
        puVar10 = (undefined8 *)((long)&pPVar3->x + lVar12);
        uVar4 = *(undefined8 *)&pPVar11->z;
        uVar5 = *puVar10;
        uVar6 = puVar10[1];
        pPVar11->x = (int)uVar5;
        pPVar11->y = (int)((ulong)uVar5 >> 0x20);
        pPVar11->z = (int)uVar6;
        pPVar11->index = (int)((ulong)uVar6 >> 0x20);
        puVar10 = (undefined8 *)((long)&this->m_data->x + lVar12);
        *puVar10 = *(undefined8 *)pPVar11;
        puVar10[1] = uVar4;
        uVar13 = (ulong)((int)uVar13 + 1);
        uVar8 = (ulong)((int)uVar8 - 1);
      }
      iVar7 = (int)uVar8;
    } while ((int)uVar13 <= iVar7);
    if (lo_00 < iVar7) {
      quickSortInternal<pointCmp>(this,CompareFunc,lo_00,iVar7);
    }
  } while ((int)uVar13 < hi);
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc,int lo, int hi)
		{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
			int i=lo, j=hi;
			T x=m_data[(lo+hi)/2];

			//  partition
			do
			{    
				while (CompareFunc(m_data[i],x)) 
					i++; 
				while (CompareFunc(x,m_data[j])) 
					j--;
				if (i<=j)
				{
					swap(i,j);
					i++; j--;
				}
			} while (i<=j);

			//  recursion
			if (lo<j) 
				quickSortInternal( CompareFunc, lo, j);
			if (i<hi) 
				quickSortInternal( CompareFunc, i, hi);
		}